

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<float> *pGVar7;
  TransformerLogLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  int iVar17;
  long lVar18;
  ImDrawIdx IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar16 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar17 = pGVar7->Count;
  lVar18 = (long)(((pGVar7->Offset + prim + 1) % iVar17 + iVar17) % iVar17) * (long)pGVar7->Stride;
  fVar26 = *(float *)((long)pGVar7->Ys + lVar18);
  dVar12 = log10((double)*(float *)((long)pGVar7->Xs + lVar18) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar9->XAxis).Range.Min;
  dVar3 = (pIVar9->XAxis).Range.Max;
  dVar13 = log10((double)fVar26 / pIVar9->YAxis[pTVar8->YAxis].Range.Min);
  iVar17 = pTVar8->YAxis;
  pIVar9 = pIVar16->CurrentPlot;
  auVar23._8_8_ = dVar13;
  auVar23._0_8_ = dVar12;
  auVar24._8_4_ = SUB84(pIVar16->LogDenY[iVar17],0);
  auVar24._0_8_ = dVar1;
  auVar24._12_4_ = (int)((ulong)pIVar16->LogDenY[iVar17] >> 0x20);
  auVar24 = divpd(auVar23,auVar24);
  dVar1 = pIVar9->YAxis[iVar17].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar17].Min;
  fVar20 = (float)(pIVar16->Mx *
                   (((double)(float)auVar24._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar4.x);
  fVar21 = (float)(pIVar16->My[iVar17] *
                   (((double)(float)auVar24._8_8_ * (pIVar9->YAxis[iVar17].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar22 = (this->P1).x;
  fVar25 = (this->P1).y;
  auVar27._0_4_ = ~-(uint)(fVar20 <= fVar22) & (uint)fVar20;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar25) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar22 < fVar20) & (uint)fVar20;
  auVar27._12_4_ = ~-(uint)(fVar25 < fVar21) & (uint)fVar21;
  auVar14._4_4_ = (uint)fVar25 & -(uint)(fVar21 <= fVar25);
  auVar14._0_4_ = (uint)fVar22 & -(uint)(fVar20 <= fVar22);
  auVar14._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar20);
  auVar14._12_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar21);
  auVar27 = auVar27 | auVar14;
  fVar26 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar27._8_8_;
  auVar15._0_4_ = -(uint)(auVar27._4_4_ < fVar26);
  auVar28._0_8_ = auVar15._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._4_4_ = -(uint)(fVar26 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar29._8_8_ = auVar28._8_8_;
  iVar17 = movmskps((int)pIVar9,auVar29);
  if (iVar17 == 0xf) {
    fVar26 = fVar25 + this->HalfWeight;
    fVar25 = fVar25 - this->HalfWeight;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar22;
    (pIVar10->pos).y = fVar26;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar20;
    pIVar10[1].pos.y = fVar25;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar22;
    pIVar10[2].pos.y = fVar25;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar20;
    pIVar10[3].pos.y = fVar26;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar6;
    *pIVar11 = IVar19;
    pIVar11[1] = IVar19 + 1;
    pIVar11[2] = IVar19 + 2;
    pIVar11[3] = IVar19;
    pIVar11[4] = IVar19 + 1;
    pIVar11[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
    fVar25 = fVar20 - this->HalfWeight;
    fVar22 = this->HalfWeight + fVar20;
    fVar26 = (this->P1).y;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10[4].pos.x = fVar25;
    pIVar10[4].pos.y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar22;
    pIVar10[1].pos.y = fVar26;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar25;
    pIVar10[2].pos.y = fVar26;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar22;
    pIVar10[3].pos.y = fVar21;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar6;
    *pIVar11 = IVar19;
    pIVar11[1] = IVar19 + 1;
    pIVar11[2] = IVar19 + 2;
    pIVar11[3] = IVar19;
    pIVar11[4] = IVar19 + 1;
    pIVar11[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  IVar4.y = fVar21;
  IVar4.x = fVar20;
  this->P1 = IVar4;
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }